

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void vera::splitFacesFromEquirectangular<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  float *pfVar1;
  int iVar2;
  CubemapFace<float> *pCVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float vec [3];
  float local_8c;
  float local_88;
  float local_84;
  ulong local_80;
  ulong local_78;
  float *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  local_78 = _height + 1 >> 1;
  local_60 = local_78 & 0xffffffff;
  fVar12 = (float)local_60;
  local_68 = local_78 * 3;
  local_80 = local_78 * local_78 * 0xc & 0x3fffffffc;
  local_48 = local_60 * 3;
  lVar10 = 0;
  local_70 = _data;
  local_40 = _width;
  local_38 = _channels;
  do {
    pCVar3 = (CubemapFace<float> *)operator_new(0x18);
    pCVar3->id = 0;
    pCVar3->width = 0;
    pCVar3->height = 0;
    pCVar3->currentOffset = 0;
    pCVar3->data = (float *)0x0;
    _faces[lVar10] = pCVar3;
    pCVar3->id = (int)lVar10;
    pfVar4 = (float *)operator_new__(local_80);
    pCVar3->data = pfVar4;
    iVar2 = (int)local_78;
    pCVar3->width = iVar2;
    pCVar3->height = iVar2;
    pCVar3->currentOffset = 0;
    lVar5 = lVar10;
    if (iVar2 != 0) {
      uVar6 = 0;
      local_58 = lVar10;
      do {
        pfVar1 = local_70;
        uVar8 = (int)local_68 * (int)uVar6;
        pfVar4 = _faces[local_58]->data;
        uVar9 = 0;
        uVar11 = 0;
        local_50 = uVar6;
        do {
          uVar7 = uVar11 & 0xffffffff;
          texelCoordToVec(&local_8c,((float)uVar9 + (float)uVar9) * (1.0 / fVar12) + -1.0,
                          ((float)(uVar6 & 0xffffffff) + (float)(uVar6 & 0xffffffff)) *
                          (1.0 / fVar12) + -1.0,(uint8_t)lVar10);
          fVar13 = atan2f(local_8c,local_84);
          fVar14 = acosf(local_88);
          lVar5 = ((ulong)(uint)(int)((fVar13 + 3.1415927) * 0.15915494 * (float)((int)_width + -1))
                  + (uint)(int)(fVar14 * 0.31830987 * (float)((int)_height + -1)) * local_40) *
                  local_38;
          pfVar4[uVar8 + uVar7] = pfVar1[lVar5];
          pfVar4[(ulong)uVar8 + uVar7 + 1] = pfVar1[lVar5 + 1];
          pfVar4[(ulong)uVar8 + uVar7 + 2] = pfVar1[lVar5 + 2];
          uVar11 = uVar11 + 3;
          uVar9 = uVar9 + 1;
        } while (local_48 != uVar11);
        uVar6 = local_50 + 1;
        lVar5 = local_58;
      } while (uVar6 != local_60);
    }
    lVar10 = lVar5 + 1;
  } while (lVar10 != 6);
  return;
}

Assistant:

void splitFacesFromEquirectangular(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    // Alloc data.
    const uint32_t faceWidth = (_height + 1)/2;
    const uint32_t faceHeight = faceWidth;

    // Get source parameters.
    const float srcWidthMinusOne  = float(int(_width-1));
    const float srcHeightMinusOne = float(int(_height-1));
    const float invfaceWidthf = 1.0f/float(faceWidth);

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;

        for (uint32_t yy = 0; yy < faceHeight; ++yy) {
            T* dstRowData = &_faces[i]->data[yy * faceWidth * 3];

            for (uint32_t xx = 0; xx < faceWidth; ++xx) {
                T* dstColumnData = &dstRowData[xx * 3];

                // Cubemap (u,v) on current face.
                const float uu = 2.0f*xx*invfaceWidthf-1.0f;
                const float vv = 2.0f*yy*invfaceWidthf-1.0f;

                // Get cubemap vector (x,y,z) from (u,v,faceIdx).
                float vec[3];
                texelCoordToVec(vec, uu, vv, i);

                // Convert cubemap vector (x,y,z) to latlong (u,v).
                float xSrcf;
                float ySrcf;
                latLongFromVec(xSrcf, ySrcf, vec);

                // Convert from [0..1] to [0..(size-1)] range.
                xSrcf *= srcWidthMinusOne;
                ySrcf *= srcHeightMinusOne;

                // Sample from latlong (u,v).
                #ifdef USE_BILINEAR_INTERPOLATION
                    const uint32_t x0 = ftou(xSrcf);
                    const uint32_t y0 = ftou(ySrcf);
                    const uint32_t x1 = M_MIN(x0+1, _width-1);
                    const uint32_t y1 = M_MIN(y0+1, _height-1);

                    const T *src0 = &_data[y0 * _width * _channels + x0 * _channels];
                    const T *src1 = &_data[y0 * _width * _channels + x1 * _channels];
                    const T *src2 = &_data[y1 * _width * _channels + x0 * _channels];
                    const T *src3 = &_data[y1 * _width * _channels + x1 * _channels];

                    const float tx = xSrcf - float(int(x0));
                    const float ty = ySrcf - float(int(y0));
                    const float invTx = 1.0f - tx;
                    const float invTy = 1.0f - ty;

                    T p0[3];
                    T p1[3];
                    T p2[3];
                    T p3[3];
                    vec3Mul(p0, src0, invTx*invTy);
                    vec3Mul(p1, src1,    tx*invTy);
                    vec3Mul(p2, src2, invTx*   ty);
                    vec3Mul(p3, src3,    tx*   ty);

                    const T rr = p0[0] + p1[0] + p2[0] + p3[0];
                    const T gg = p0[1] + p1[1] + p2[1] + p3[1];
                    const T bb = p0[2] + p1[2] + p2[2] + p3[2];

                    dstColumnData[0] = rr;
                    dstColumnData[1] = gg;
                    dstColumnData[2] = bb;
                #else
                    const uint32_t xSrc = ftou(xSrcf);
                    const uint32_t ySrc = ftou(ySrcf);

                    dstColumnData[0] = _data[ySrc * _width * _channels + xSrc * _channels + 0];
                    dstColumnData[1] = _data[ySrc * _width * _channels + xSrc * _channels + 1];
                    dstColumnData[2] = _data[ySrc * _width * _channels + xSrc * _channels + 2];
                #endif
            }
        }
    }
}